

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlFreeNsList(xmlNsPtr cur)

{
  _xmlNs *p_Var1;
  
  if (cur != (xmlNsPtr)0x0) {
    while (cur != (xmlNsPtr)0x0) {
      p_Var1 = cur->next;
      xmlFreeNs(cur);
      cur = p_Var1;
    }
  }
  return;
}

Assistant:

void
xmlFreeNsList(xmlNsPtr cur) {
    xmlNsPtr next;
    if (cur == NULL) {
	return;
    }
    while (cur != NULL) {
        next = cur->next;
        xmlFreeNs(cur);
	cur = next;
    }
}